

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlUnloadVertexArray(uint vaoId)

{
  uint vaoId_local;
  
  if (RLGL.ExtSupported.vao) {
    vaoId_local = vaoId;
    (*glad_glBindVertexArray)(0);
    (*glad_glDeleteVertexArrays)(1,&vaoId_local);
    TraceLog(3,"VAO: [ID %i] Unloaded vertex array data from VRAM (GPU)",(ulong)vaoId_local);
  }
  return;
}

Assistant:

void rlUnloadVertexArray(unsigned int vaoId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.ExtSupported.vao)
    {
        glBindVertexArray(0);
        glDeleteVertexArrays(1, &vaoId);
        TRACELOG(RL_LOG_INFO, "VAO: [ID %i] Unloaded vertex array data from VRAM (GPU)", vaoId);
    }
#endif
}